

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::~Signal
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this)

{
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this_local;
  
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_00164a28;
  boost::
  function2<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_int>
  ::~function2(&this->Tfunction);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&this->Tcopy2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&this->Tcopy1);
  SignalBase<int>::~SignalBase(&this->super_SignalBase<int>);
  return;
}

Assistant:

virtual ~Signal() {}